

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O2

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::RoundEvenCaseInstance::compare
          (RoundEvenCaseInstance *this,void **inputs,void **outputs)

{
  float a;
  uint uVar1;
  pointer pSVar2;
  uint uVar3;
  uint uVar4;
  deUint32 dVar5;
  ostream *poVar6;
  Hex<8UL> hex;
  ulong uVar7;
  int roundedVal;
  int iVar8;
  ulong uVar9;
  deUint32 u32;
  float value;
  float fVar10;
  float fVar11;
  float fVar12;
  deUint32 u32_1;
  HexFloat local_34;
  
  pSVar2 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = *(uint *)((long)&(pSVar2->varType).m_data + 4);
  uVar3 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (uVar1 - 1 < 2) {
    uVar9 = 0;
    uVar7 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar7 = uVar9;
    }
    for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      fVar11 = *(float *)((long)*outputs + uVar9 * 4);
      fVar10 = roundEven(*(float *)((long)*inputs + uVar9 * 4));
      if (uVar1 == 2) {
        uVar4 = (int)fVar10 - (int)fVar11;
        if ((uint)fVar10 < (uint)fVar11) {
          uVar4 = -((int)fVar10 - (int)fVar11);
        }
      }
      else {
        uVar4 = getUlpDiffIgnoreZeroSign(fVar11,fVar10);
      }
      if (uVar4 != 0) {
        poVar6 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                                 "Expected [");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar9);
        poVar6 = std::operator<<(poVar6,"] = ");
        local_34.value = fVar10;
        poVar6 = anon_unknown_0::operator<<(poVar6,&local_34);
        poVar6 = std::operator<<(poVar6,", got ULP diff ");
LAB_0078488c:
        hex.value._4_4_ = 0;
        hex.value._0_4_ = uVar4;
        tcu::Format::operator<<(poVar6,hex);
        return false;
      }
    }
  }
  else {
    uVar4 = ~(-1 << (0x17U - (char)*(int *)(&DAT_009ceaec + (ulong)uVar1 * 4) & 0x1f));
    fVar11 = getEpsFromBits(value,*(int *)(&DAT_009ceaec + (ulong)uVar1 * 4));
    uVar9 = 0;
    uVar7 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar7 = uVar9;
    }
    for (; uVar9 != uVar7; uVar9 = uVar9 + 1) {
      fVar10 = *(float *)((long)*inputs + uVar9 * 4);
      a = *(float *)((long)*outputs + uVar9 * 4);
      fVar12 = roundEven(fVar10 - fVar11);
      fVar10 = roundEven(fVar10 + fVar11);
      iVar8 = (int)fVar12;
      do {
        if ((int)fVar10 < iVar8) {
          poVar6 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                                   "Expected [");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar9);
          poVar6 = std::operator<<(poVar6,"] = [");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)fVar12);
          poVar6 = std::operator<<(poVar6,", ");
          poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)fVar10);
          poVar6 = std::operator<<(poVar6,"] with ULP threshold ");
          goto LAB_0078488c;
        }
        dVar5 = getUlpDiffIgnoreZeroSign(a,(float)iVar8);
        iVar8 = iVar8 + 1;
      } while (uVar4 < dVar5);
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasSignedZero	= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			// Require exact rounding result.
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const float		ref			= roundEven(in0);

				const deUint32	ulpDiff		= hasSignedZero ? getUlpDiff(out0, ref) : getUlpDiffIgnoreZeroSign(out0, ref);

				if (ulpDiff > 0)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
					return false;
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(roundEven(in0-eps));
				const int		maxRes		= int(roundEven(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiffIgnoreZeroSign(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}